

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RippleOP.cpp
# Opt level: O3

void __thiscall
OpenMD::RippleOP::RippleOP
          (RippleOP *this,SimInfo *info,string *filename,string *sele1,string *sele2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SelectionManager *this_00;
  pointer *pppVar2;
  pointer pcVar3;
  iterator __position;
  string *script;
  int iVar4;
  int iVar5;
  long *plVar6;
  StuntDouble *pSVar7;
  long lVar8;
  int j;
  int i;
  undefined1 local_d0 [24];
  long lStack_b8;
  SelectionEvaluator *local_b0;
  SelectionEvaluator *local_a8;
  SelectionManager *local_a0;
  int local_94;
  vector<std::pair<OpenMD::StuntDouble*,OpenMD::StuntDouble*>,std::allocator<std::pair<OpenMD::StuntDouble*,OpenMD::StuntDouble*>>>
  *local_90;
  string *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  string *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  string local_50;
  
  local_58 = filename;
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,1);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__RippleOP_00337390;
  paVar1 = &(this->selectionScript1_).field_2;
  (this->selectionScript1_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (sele1->_M_dataplus)._M_p;
  local_60 = sele1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript1_,pcVar3,pcVar3 + sele1->_M_string_length);
  local_88 = &this->selectionScript2_;
  local_80 = &(this->selectionScript2_).field_2;
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)local_80;
  pcVar3 = (sele2->_M_dataplus)._M_p;
  local_78 = &this->selectionScript1_;
  local_70 = paVar1;
  local_68 = sele2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar3,pcVar3 + sele2->_M_string_length);
  local_a0 = &this->seleMan1_;
  SelectionManager::SelectionManager(local_a0,info);
  this_00 = &this->seleMan2_;
  SelectionManager::SelectionManager(this_00,info);
  local_a8 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(local_a8,info);
  local_b0 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(local_b0,info);
  local_90 = (vector<std::pair<OpenMD::StuntDouble*,OpenMD::StuntDouble*>,std::allocator<std::pair<OpenMD::StuntDouble*,OpenMD::StuntDouble*>>>
              *)&this->sdPairs_;
  (this->avgOPHeadUpper).director.super_Vector<double,_3U>.data_[0] = 0.0;
  (this->avgOPHeadUpper).director.super_Vector<double,_3U>.data_[1] = 0.0;
  (this->avgOPHeadUpper).director.super_Vector<double,_3U>.data_[2] = 0.0;
  (this->avgOPHeadLower).director.super_Vector<double,_3U>.data_[0] = 0.0;
  (this->avgOPHeadLower).director.super_Vector<double,_3U>.data_[1] = 0.0;
  (this->avgOPHeadLower).director.super_Vector<double,_3U>.data_[2] = 0.0;
  (this->errOPHeadUpper).director.super_Vector<double,_3U>.data_[0] = 0.0;
  (this->errOPHeadUpper).director.super_Vector<double,_3U>.data_[1] = 0.0;
  (this->errOPHeadUpper).director.super_Vector<double,_3U>.data_[2] = 0.0;
  (this->errOPHeadLower).director.super_Vector<double,_3U>.data_[0] = 0.0;
  (this->errOPHeadLower).director.super_Vector<double,_3U>.data_[1] = 0.0;
  (this->errOPHeadLower).director.super_Vector<double,_3U>.data_[2] = 0.0;
  (this->avgOPTail).director.super_Vector<double,_3U>.data_[0] = 0.0;
  (this->avgOPTail).director.super_Vector<double,_3U>.data_[1] = 0.0;
  (this->avgOPTail).director.super_Vector<double,_3U>.data_[2] = 0.0;
  (this->errOPTail).director.super_Vector<double,_3U>.data_[0] = 0.0;
  (this->errOPTail).director.super_Vector<double,_3U>.data_[1] = 0.0;
  (this->errOPTail).director.super_Vector<double,_3U>.data_[2] = 0.0;
  (this->sdPairs_).
  super__Vector_base<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sdPairs_).
  super__Vector_base<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sdPairs_).
  super__Vector_base<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->orderParamsHeadUpper_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->orderParamsHeadUpper_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orderParamsHeadUpper_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->orderParamsHeadLower_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->orderParamsHeadLower_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orderParamsHeadLower_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->orderParamsTail_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->orderParamsTail_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orderParamsTail_).
  super__Vector_base<OpenMD::RippleOP::OrderParam,_std::allocator<OpenMD::RippleOP::OrderParam>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getPrefix(&local_50,local_58);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  pSVar7 = (StuntDouble *)(plVar6 + 2);
  if ((StuntDouble *)*plVar6 == pSVar7) {
    local_d0._16_8_ =
         (((vector<bool,_std::allocator<bool>_> *)&pSVar7->_vptr_StuntDouble)->
         super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
         super__Bit_iterator_base._M_p;
    lStack_b8 = plVar6[3];
    local_d0._0_8_ = (StuntDouble *)(local_d0 + 0x10);
  }
  else {
    local_d0._16_8_ =
         (((vector<bool,_std::allocator<bool>_> *)&pSVar7->_vptr_StuntDouble)->
         super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
         super__Bit_iterator_base._M_p;
    local_d0._0_8_ = (StuntDouble *)*plVar6;
  }
  local_d0._8_8_ = plVar6[1];
  *plVar6 = (long)pSVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((StuntDouble *)local_d0._0_8_ != (StuntDouble *)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_d0._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  script = local_68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  SelectionEvaluator::loadScriptString(local_a8,local_60);
  SelectionEvaluator::loadScriptString(local_b0,script);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_d0,local_a8);
    lVar8 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar8),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_d0._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar8));
      lVar8 = lVar8 + 0x28;
    } while (lVar8 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_d0);
  }
  else {
    builtin_strncpy(painCave.errMsg,"--sele1 must be static selection\n",0x22);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_d0,local_b0);
    lVar8 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan2_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar8),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_d0._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar8));
      lVar8 = lVar8 + 0x28;
    } while (lVar8 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_d0);
  }
  else {
    builtin_strncpy(painCave.errMsg,"--sele2 must be static selection\n",0x22);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  iVar4 = OpenMDBitSet::countBits
                    ((this->seleMan1_).ss_.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  iVar5 = OpenMDBitSet::countBits
                    ((this->seleMan2_).ss_.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (iVar4 != iVar5) {
    memcpy(&painCave,"The number of selected Stuntdoubles are not the same in --sele1 and sele2\n",
           0x4b);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  pSVar7 = SelectionManager::beginSelected(local_a0,(int *)&local_50);
  local_d0._8_8_ = SelectionManager::beginSelected(this_00,&local_94);
  while ((pSVar7 != (StuntDouble *)0x0 && ((StuntDouble *)local_d0._8_8_ != (StuntDouble *)0x0))) {
    __position._M_current =
         (this->sdPairs_).
         super__Vector_base<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_d0._0_8_ = pSVar7;
    if (__position._M_current ==
        (this->sdPairs_).
        super__Vector_base<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::pair<OpenMD::StuntDouble*,OpenMD::StuntDouble*>,std::allocator<std::pair<OpenMD::StuntDouble*,OpenMD::StuntDouble*>>>
      ::_M_realloc_insert<std::pair<OpenMD::StuntDouble*,OpenMD::StuntDouble*>>
                (local_90,__position,(pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*> *)local_d0)
      ;
    }
    else {
      (__position._M_current)->first = pSVar7;
      (__position._M_current)->second = (StuntDouble *)local_d0._8_8_;
      pppVar2 = &(this->sdPairs_).
                 super__Vector_base<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar2 = *pppVar2 + 1;
    }
    pSVar7 = SelectionManager::nextSelected(local_a0,(int *)&local_50);
    local_d0._8_8_ = SelectionManager::nextSelected(this_00,&local_94);
  }
  return;
}

Assistant:

RippleOP::RippleOP(SimInfo* info, const std::string& filename,
                     const std::string& sele1, const std::string& sele2) :
      StaticAnalyser(info, filename, 1),
      selectionScript1_(sele1), selectionScript2_(sele2), seleMan1_(info),
      seleMan2_(info), evaluator1_(info), evaluator2_(info) {
    setOutputName(getPrefix(filename) + ".rp2");

    evaluator1_.loadScriptString(sele1);
    evaluator2_.loadScriptString(sele2);

    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--sele1 must be static selection\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--sele2 must be static selection\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    if (seleMan1_.getSelectionCount() != seleMan2_.getSelectionCount()) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "The number of selected Stuntdoubles are not the same in --sele1 "
          "and sele2\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    int i;
    int j;
    StuntDouble* sd1;
    StuntDouble* sd2;
    for (sd1 = seleMan1_.beginSelected(i), sd2 = seleMan2_.beginSelected(j);
         sd1 != NULL && sd2 != NULL;
         sd1 = seleMan1_.nextSelected(i), sd2 = seleMan2_.nextSelected(j)) {
      sdPairs_.push_back(std::make_pair(sd1, sd2));
    }
  }